

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_net.c
# Opt level: O0

int tnt_connect(tnt_stream *s)

{
  tnt_stream_net *s_00;
  tnt_error tVar1;
  int iVar2;
  ssize_t sVar3;
  tnt_stream_net *sn;
  tnt_stream *s_local;
  
  s_00 = (tnt_stream_net *)s->data;
  if (s_00->inited == 0) {
    tnt_init(s);
  }
  if (s_00->connected != 0) {
    tnt_close(s);
  }
  tVar1 = tnt_io_connect(s_00);
  s_00->error = tVar1;
  if (s_00->error == TNT_EOK) {
    sVar3 = (*s->read)(s,s_00->greeting,0x80);
    if ((sVar3 == -1) || (s_00->error != TNT_EOK)) {
      s_local._4_4_ = -1;
    }
    else if (((((s_00->opt).uri)->login == (char *)0x0) ||
             (((s_00->opt).uri)->password == (char *)0x0)) ||
            (iVar2 = tnt_authenticate(s), iVar2 != -1)) {
      s_local._4_4_ = 0;
    }
    else {
      s_local._4_4_ = -1;
    }
  }
  else {
    s_local._4_4_ = -1;
  }
  return s_local._4_4_;
}

Assistant:

int tnt_connect(struct tnt_stream *s)
{
	struct tnt_stream_net *sn = TNT_SNET_CAST(s);
	if (!sn->inited) tnt_init(s);
	if (sn->connected)
		tnt_close(s);
	sn->error = tnt_io_connect(sn);
	if (sn->error != TNT_EOK)
		return -1;
	if (s->read(s, sn->greeting, TNT_GREETING_SIZE) == -1 ||
	    sn->error != TNT_EOK)
		return -1;
	if (sn->opt.uri->login && sn->opt.uri->password)
		if (tnt_authenticate(s) == -1)
			return -1;
	return 0;
}